

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElemStack.cpp
# Opt level: O0

XMLSize_t __thiscall xercesc_4_0::ElemStack::addLevel(ElemStack *this)

{
  StackElem *this_00;
  ElemStack *this_local;
  
  if (this->fStackTop == this->fStackCapacity) {
    expandStack(this);
  }
  if (this->fStack[this->fStackTop] == (StackElem *)0x0) {
    this_00 = (StackElem *)XMemory::operator_new(0x70,this->fMemoryManager);
    StackElem::StackElem(this_00);
    this->fStack[this->fStackTop] = this_00;
    this->fStack[this->fStackTop]->fChildCapacity = 0;
    this->fStack[this->fStackTop]->fChildren = (QName **)0x0;
    this->fStack[this->fStackTop]->fMapCapacity = 0;
    this->fStack[this->fStackTop]->fMap = (PrefMapElem *)0x0;
    this->fStack[this->fStackTop]->fSchemaElemName = (XMLCh *)0x0;
    this->fStack[this->fStackTop]->fSchemaElemNameMaxLen = 0;
  }
  this->fStack[this->fStackTop]->fThisElement = (XMLElementDecl *)0x0;
  this->fStack[this->fStackTop]->fReaderNum = 0xffffffff;
  this->fStack[this->fStackTop]->fChildCount = 0;
  this->fStack[this->fStackTop]->fMapCount = 0;
  this->fStack[this->fStackTop]->fValidationFlag = false;
  this->fStack[this->fStackTop]->fCommentOrPISeen = false;
  this->fStack[this->fStackTop]->fReferenceEscaped = false;
  this->fStack[this->fStackTop]->fCurrentURI = this->fUnknownNamespaceId;
  this->fStack[this->fStackTop]->fCurrentScope = 0xfffffffe;
  this->fStack[this->fStackTop]->fCurrentGrammar = (Grammar *)0x0;
  this->fStackTop = this->fStackTop + 1;
  return this->fStackTop - 1;
}

Assistant:

XMLSize_t ElemStack::addLevel()
{
    // See if we need to expand the stack
    if (fStackTop == fStackCapacity)
        expandStack();

    // If this element has not been initialized yet, then initialize it
    if (!fStack[fStackTop])
    {
        fStack[fStackTop] = new (fMemoryManager) StackElem;
        fStack[fStackTop]->fChildCapacity = 0;
        fStack[fStackTop]->fChildren = 0;
        fStack[fStackTop]->fMapCapacity = 0;
        fStack[fStackTop]->fMap = 0;
        fStack[fStackTop]->fSchemaElemName = 0;
        fStack[fStackTop]->fSchemaElemNameMaxLen = 0;
    }

    // Set up the new top row
    fStack[fStackTop]->fThisElement = 0;
    fStack[fStackTop]->fReaderNum = 0xFFFFFFFF;
    fStack[fStackTop]->fChildCount = 0;
    fStack[fStackTop]->fMapCount = 0;
    fStack[fStackTop]->fValidationFlag = false;
    fStack[fStackTop]->fCommentOrPISeen = false;
    fStack[fStackTop]->fReferenceEscaped = false;
    fStack[fStackTop]->fCurrentURI = fUnknownNamespaceId;
    fStack[fStackTop]->fCurrentScope = Grammar::TOP_LEVEL_SCOPE;
    fStack[fStackTop]->fCurrentGrammar = 0;

    // Bump the top of stack
    fStackTop++;

    return fStackTop-1;
}